

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.cpp
# Opt level: O0

int SendNbSimpleMessageAndWaitNsMDM(MDM *pMDM,BOOL *pbError,int n,int nb,int msgid,char *msg)

{
  int iVar1;
  undefined1 local_50 [8];
  timeval tv;
  int i;
  uint8 buf [4];
  char *msg_local;
  int msgid_local;
  int nb_local;
  int n_local;
  BOOL *pbError_local;
  MDM *pMDM_local;
  
  tv.tv_usec._0_4_ = 0;
  memset((void *)((long)&tv.tv_usec + 4),0,4);
  if (msg[3] == '\0') {
    strcpy((char *)((long)&tv.tv_usec + 4),msg);
  }
  else {
    tv.tv_usec._4_4_ = *(undefined4 *)msg;
  }
  tv.tv_usec._0_4_ = 0;
  while( true ) {
    if (nb <= (int)tv.tv_usec) {
      return 0;
    }
    iVar1 = SendAllDataMDM(pMDM,(uint8 *)((long)&tv.tv_usec + 4),4);
    if (iVar1 != 0) break;
    iVar1 = gettimeofday((timeval *)local_50,(__timezone_ptr_t)0x0);
    if (iVar1 != 0) {
      local_50 = (undefined1  [8])0x0;
      tv.tv_sec = 0;
    }
    if (pMDM->bSaveRawData != 0) {
      fprintf((FILE *)pMDM->pfSaveFile,"%d;%d;%d;%c;%.4s;\n",(ulong)local_50 & 0xffffffff,
              tv.tv_sec & 0xffffffff,(ulong)(uint)msgid,0x73,(undefined1 *)((long)&tv.tv_usec + 4));
      fflush((FILE *)pMDM->pfSaveFile);
    }
    iVar1 = WaitNsMDM(n);
    if (iVar1 != 0) {
      return 1;
    }
    tv.tv_usec._0_4_ = (int)tv.tv_usec + 1;
  }
  *pbError = 1;
  return 1;
}

Assistant:

inline int SendNbSimpleMessageAndWaitNsMDM(MDM* pMDM, BOOL* pbError, int n, int nb, int msgid, char* msg)
{
	uint8 buf[4];
	int i = 0;
	struct timeval tv;

	memset(buf, 0, sizeof(buf));
	if (msg[3] == 0) strcpy((char*)buf, msg); else memcpy(buf, msg, sizeof(buf));
	for (i = 0; i < nb; i++)
	{
		if (SendAllDataMDM(pMDM, buf, sizeof(buf)) != EXIT_SUCCESS)
		{
			*pbError = TRUE;
			return EXIT_FAILURE;
		}
		if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
		if (pMDM->bSaveRawData)
		{
			fprintf(pMDM->pfSaveFile, "%d;%d;%d;%c;%.4s;\n", (int)tv.tv_sec, (int)tv.tv_usec, msgid, 's', buf);
			fflush(pMDM->pfSaveFile);
		}
		if (WaitNsMDM(n) != EXIT_SUCCESS) return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}